

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

void __thiscall jbcoin::STAmount::setJson(STAmount *this,Value *elem)

{
  ushort uVar1;
  char *pcVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder *pVVar5;
  ValueHolder VVar6;
  ValueHolder VVar7;
  Currency *extraout_RDX;
  Currency *extraout_RDX_00;
  Currency *currency;
  undefined1 in_R9B;
  ValueHolder local_50;
  undefined4 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ValueHolder local_30;
  ushort local_28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pcVar2 = (char *)operator_new(0x30);
  pcVar2[0x10] = '\0';
  pcVar2[0x11] = '\0';
  pcVar2[0x12] = '\0';
  pcVar2[0x13] = '\0';
  pcVar2[0x14] = '\0';
  pcVar2[0x15] = '\0';
  pcVar2[0x16] = '\0';
  pcVar2[0x17] = '\0';
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(char **)(pcVar2 + 0x18) = pcVar2 + 8;
  *(char **)(pcVar2 + 0x20) = pcVar2 + 8;
  pcVar2[0x28] = '\0';
  pcVar2[0x29] = '\0';
  pcVar2[0x2a] = '\0';
  pcVar2[0x2b] = '\0';
  pcVar2[0x2c] = '\0';
  pcVar2[0x2d] = '\0';
  pcVar2[0x2e] = '\0';
  pcVar2[0x2f] = '\0';
  local_50 = (ValueHolder)(elem->value_).real_;
  (elem->value_).string_ = pcVar2;
  uVar1 = *(ushort *)&elem->field_0x8;
  *(ushort *)&elem->field_0x8 = uVar1 & 0xfe00 | 7;
  local_48 = CONCAT22(local_48._2_2_,uVar1) & 0xffff01ff;
  Json::Value::~Value((Value *)&local_50);
  if (this->mIsNative == false) {
    (*(this->super_STBase)._vptr_STBase[6])(&local_50,this);
    local_28 = 0x104;
    Json::valueAllocator();
    VVar4._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (Json::valueAllocator::valueAllocator,local_50.real_,(ulong)local_48);
    VVar4._4_4_ = extraout_var_00;
    local_30 = VVar4;
    pVVar5 = &Json::Value::resolveReference(elem,"value",true)->value_;
    local_30 = *pVVar5;
    *pVVar5 = VVar4;
    local_28 = *(ushort *)(pVVar5 + 1);
    *(ushort *)(pVVar5 + 1) = local_28 & 0xfe00 | 0x104;
    local_28 = local_28 & 0x1ff;
    Json::Value::~Value((Value *)&local_30);
    currency = extraout_RDX;
    if (local_50 != &local_40) {
      operator_delete(local_50.string_,local_40._M_allocated_capacity + 1);
      currency = extraout_RDX_00;
    }
    to_string_abi_cxx11_((string *)&local_50,(jbcoin *)&this->mIssue,currency);
    local_28 = 0x104;
    Json::valueAllocator();
    VVar6._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (Json::valueAllocator::valueAllocator,local_50.real_,(ulong)local_48);
    VVar6._4_4_ = extraout_var_01;
    local_30 = VVar6;
    pVVar5 = &Json::Value::resolveReference(elem,"currency",true)->value_;
    local_30 = *pVVar5;
    *pVVar5 = VVar6;
    local_28 = *(ushort *)(pVVar5 + 1);
    *(ushort *)(pVVar5 + 1) = local_28 & 0xfe00 | 0x104;
    local_28 = local_28 & 0x1ff;
    Json::Value::~Value((Value *)&local_30);
    if (local_50 != &local_40) {
      operator_delete(local_50.string_,local_40._M_allocated_capacity + 1);
    }
    encodeToken_abi_cxx11_
              ((string *)&local_50,(jbcoin *)0x0,(char)this + '$',(void *)0x14,0,(bool)in_R9B);
    local_28 = 0x104;
    Json::valueAllocator();
    VVar7._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (Json::valueAllocator::valueAllocator,local_50.real_,(ulong)local_48);
    VVar7._4_4_ = extraout_var_02;
    local_30 = VVar7;
    pVVar5 = &Json::Value::resolveReference(elem,"issuer",true)->value_;
    local_30 = *pVVar5;
    *pVVar5 = VVar7;
    local_28 = *(ushort *)(pVVar5 + 1);
    *(ushort *)(pVVar5 + 1) = local_28 & 0xfe00 | 0x104;
    local_28 = local_28 & 0x1ff;
    Json::Value::~Value((Value *)&local_30);
    if (local_50 == &local_40) {
      return;
    }
  }
  else {
    (*(this->super_STBase)._vptr_STBase[6])(&local_50,this);
    Json::valueAllocator();
    VVar3._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (Json::valueAllocator::valueAllocator,local_50.real_,(ulong)local_48);
    VVar3._4_4_ = extraout_var;
    local_30 = elem->value_;
    elem->value_ = VVar3;
    local_28 = *(ushort *)&elem->field_0x8;
    *(ushort *)&elem->field_0x8 = local_28 & 0xfe00 | 0x104;
    local_28 = local_28 & 0x1ff;
    Json::Value::~Value((Value *)&local_30);
    if (local_50 == &local_40) {
      return;
    }
  }
  operator_delete(local_50.string_,local_40._M_allocated_capacity + 1);
  return;
}

Assistant:

void STAmount::setJson (Json::Value& elem) const
{
    elem = Json::objectValue;

    if (!mIsNative)
    {
        // It is an error for currency or issuer not to be specified for valid
        // json.
        elem[jss::value]      = getText ();
        elem[jss::currency]   = to_string (mIssue.currency);
        elem[jss::issuer]     = to_string (mIssue.account);
    }
    else
    {
        elem = getText ();
    }
}